

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g12s.c
# Opt level: O1

err_t g12sVerify(g12s_params *params,octet *hash,octet *sig,octet *pubkey)

{
  u32 uVar1;
  qr_o *pqVar2;
  ec_o *ec_00;
  word *dest;
  u64 *dest_00;
  err_t eVar3;
  bool_t bVar4;
  int iVar5;
  u64 *dest_01;
  ulong n;
  word *pwVar6;
  uint uVar7;
  ulong uVar8;
  void *stack;
  ec_o *ec;
  word *local_48;
  u64 *local_40;
  word *local_38;
  ulong count;
  
  ec = (ec_o *)0x0;
  eVar3 = g12sEcCreate(&ec,params,g12sVerify_deep);
  if (eVar3 == 0) {
    uVar1 = params->l;
    uVar7 = uVar1 + 7 >> 3;
    count = (ulong)uVar7;
    bVar4 = memIsValid(hash,count);
    if (((bVar4 != 0) && (bVar4 = memIsValid(sig,(ulong)(uVar7 * 2)), ec_00 = ec, bVar4 != 0)) &&
       (bVar4 = memIsValid(pubkey,ec->f->no * 2), bVar4 != 0)) {
      uVar7 = uVar1 + 0x3f >> 6;
      n = (ulong)uVar7;
      pwVar6 = (word *)((long)&(ec_00->hdr).keep + (ec_00->hdr).keep);
      pqVar2 = ec_00->f;
      local_38 = pwVar6 + pqVar2->n * 2;
      uVar8 = (ulong)(uVar7 * 8);
      dest_01 = (u64 *)((long)local_38 + uVar8);
      local_40 = (u64 *)((long)dest_01 + uVar8);
      stack = (void *)(uVar8 + (long)local_40);
      bVar4 = (*pqVar2->from)(pwVar6,pubkey,pqVar2,stack);
      if (bVar4 != 0) {
        pqVar2 = ec_00->f;
        bVar4 = (*pqVar2->from)(pwVar6 + pqVar2->n,pubkey + pqVar2->no,pqVar2,stack);
        if (bVar4 != 0) {
          local_48 = pwVar6;
          memCopy(dest_01,sig + count,count);
          memRev(dest_01,count);
          u64From(dest_01,dest_01,count);
          pwVar6 = local_38;
          memCopy(local_38,sig,count);
          memRev(pwVar6,count);
          u64From(pwVar6,pwVar6,count);
          bVar4 = wwIsZero(dest_01,n);
          if (((bVar4 != 0) || (bVar4 = wwIsZero(pwVar6,n), bVar4 != 0)) ||
             ((iVar5 = wwCmp(dest_01,ec_00->order,n), -1 < iVar5 ||
              (iVar5 = wwCmp(pwVar6,ec_00->order,n), dest_00 = local_40, -1 < iVar5)))) {
            blobClose(ec_00);
            return 0x1fe;
          }
          memCopy(local_40,hash,count);
          memRev(dest_00,count);
          u64From(dest_00,dest_00,count);
          zzMod(dest_00,dest_00,n,ec_00->order,n,stack);
          bVar4 = wwIsZero(dest_00,n);
          if (bVar4 != 0) {
            *dest_00 = 1;
          }
          zzInvMod(dest_00,dest_00,ec_00->order,n,stack);
          zzMulMod(dest_01,dest_01,dest_00,ec_00->order,n,stack);
          zzMulMod(dest_00,dest_00,pwVar6,ec_00->order,n,stack);
          zzNegMod(dest_00,dest_00,ec_00->order,n);
          dest = local_48;
          bVar4 = ecAddMulA(local_48,ec_00,stack,2,ec_00->base,dest_01,n,local_48,dest_00,n);
          if (bVar4 != 0) {
            (*ec_00->f->to)((octet *)dest,dest,ec_00->f,stack);
            u64From(dest,dest,ec_00->f->no);
            zzMod(dest_01,dest,ec_00->f->n,ec_00->order,n,stack);
            bVar4 = wwEq(pwVar6,dest_01,n);
            eVar3 = 0;
            if (bVar4 == 0) {
              eVar3 = 0x1fe;
            }
            blobClose(ec_00);
            return eVar3;
          }
          blobClose(ec_00);
          return 0x1f6;
        }
      }
      blobClose(ec_00);
      return 0x1f9;
    }
    blobClose(ec);
    eVar3 = 0x6d;
  }
  return eVar3;
}

Assistant:

err_t g12sVerify(const g12s_params* params, const octet hash[], 
	const octet sig[], const octet pubkey[])
{
	err_t code;
	size_t m, mo;
	// состояние
	ec_o* ec = 0;
	word* Q;		/* [2n] открытый ключ / точка R */
	word* r;		/* [m] первая (старшая) часть подписи */
	word* s;		/* [m] вторая часть подписи */
	word* e;		/* [m] обработанное хэш-значение, v */
	void* stack;
	// старт
	code = g12sEcCreate(&ec, params, g12sVerify_deep);
	ERR_CALL_CHECK(code);
	// размерности order
	m = W_OF_B(params->l);
	mo = O_OF_B(params->l);
	// проверить входные указатели
	if (!memIsValid(hash, mo) ||
		!memIsValid(sig, 2 * mo) ||
		!memIsValid(pubkey, 2 * ec->f->no))
	{
		g12sEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	Q = objEnd(ec, word);
	r = Q + 2 * ec->f->n;
	s = r + m;
	e = s + m;
	stack = e + m;
	// загрузить Q
	if (!qrFrom(ecX(Q), pubkey, ec->f, stack) ||
		!qrFrom(ecY(Q, ec->f->n), pubkey + ec->f->no, ec->f, stack))
	{
		g12sEcClose(ec);
		return ERR_BAD_PUBKEY;
	}
	// загрузить r и s
	memCopy(s, sig + mo, mo);
	memRev(s, mo);
	wwFrom(s, s, mo);
	memCopy(r, sig, mo);
	memRev(r, mo);
	wwFrom(r, r, mo);
	if (wwIsZero(s, m) || 
		wwIsZero(r, m) || 
		wwCmp(s, ec->order, m) >= 0 ||
		wwCmp(r, ec->order, m) >= 0)
	{
		g12sEcClose(ec);
		return ERR_BAD_SIG;
	}
	// e <- hash \mod q
	memCopy(e, hash, mo);
	memRev(e, mo);
	wwFrom(e, e, mo);
	zzMod(e, e, m, ec->order, m, stack);
	// e == 0 => e <- 1
	if (wwIsZero(e, m))
		e[0] = 1;
	// e <- e^{-1} \mod q [v]
	zzInvMod(e, e, ec->order, m, stack);
	// s <- s e \mod q [z1]
	zzMulMod(s, s, e, ec->order, m, stack);
	// e <- - e r \mod q [z2]
	zzMulMod(e, e, r, ec->order, m, stack);
	zzNegMod(e, e, ec->order, m);
	// Q <- s P + e Q [z1 P + z2 Q = R]
	if (!ecAddMulA(Q, ec, stack, 2, ec->base, s, m, Q, e, m))
	{
		g12sEcClose(ec);
		return ERR_BAD_PARAMS;
	}
	// s <- x_Q \mod q [x_R \mod q]
	qrTo((octet*)Q, ecX(Q), ec->f, stack);
	wwFrom(Q, Q, ec->f->no);
	zzMod(s, Q, ec->f->n, ec->order, m, stack);
	// s == r?
	code = wwEq(r, s, m) ? ERR_OK : ERR_BAD_SIG;
	// завершение
	g12sEcClose(ec);
	return code;
}